

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_empty_final_object(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint __fd;
  ulong __n;
  void *__s1;
  void *__s2;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong unaff_R12;
  undefined **ppuVar15;
  undefined8 *unaff_R13;
  void *unaff_R14;
  char *unaff_R15;
  bson_t b;
  bson_error_t error;
  code **ppcVar16;
  undefined4 uStack_edc;
  undefined8 uStack_ed8;
  undefined2 uStack_ed0;
  int iStack_ec8;
  int iStack_ec4;
  char acStack_ec0 [504];
  code *pcStack_cc8;
  undefined1 auStack_cb8 [512];
  char *pcStack_ab8;
  code *pcStack_ab0;
  int iStack_aa0;
  int iStack_a9c;
  char acStack_a98 [504];
  long *plStack_8a0;
  ulong uStack_898;
  char *pcStack_890;
  code *pcStack_888;
  long lStack_810;
  long lStack_808;
  undefined1 auStack_800 [128];
  undefined1 auStack_780 [232];
  undefined1 auStack_698 [608];
  long *plStack_438;
  code *pcStack_430;
  undefined1 auStack_428 [8];
  char acStack_420 [16];
  char *pcStack_410;
  code *pcStack_408;
  uint local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_2b8 [648];
  
  pcStack_408 = (code *)0x0;
  pcStack_410 = "}";
  acStack_420[8] = -0x52;
  acStack_420[9] = '/';
  acStack_420[10] = '\x13';
  acStack_420[0xb] = '\0';
  acStack_420[0xc] = '\0';
  acStack_420[0xd] = '\0';
  acStack_420[0xe] = '\0';
  acStack_420[0xf] = '\0';
  __n = bcon_new(0,"a","{","b","{");
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  pcStack_408 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&local_380,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,local_2b8);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x133023;
    unaff_R15 = (char *)bson_get_data(&local_380);
    pcStack_408 = (code *)0x13302e;
    unaff_R14 = (void *)bson_get_data(__n);
    if (*(int *)(__n + 4) == local_380._4_4_) {
      pcStack_408 = (code *)0x133043;
      __s1 = (void *)bson_get_data(__n);
      pcStack_408 = (code *)0x133053;
      __s2 = (void *)bson_get_data(&local_380);
      pcStack_408 = (code *)0x133061;
      iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x133072;
        bson_destroy(&local_380);
        pcStack_408 = (code *)0x13307a;
        bson_destroy(__n);
        return;
      }
    }
    unaff_R13 = &local_380;
    pcStack_408 = (code *)0x13309b;
    uVar4 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_408 = (code *)0x1330a8;
    uVar5 = bson_as_canonical_extended_json(__n);
    uVar12 = 0xffffffff;
    if (local_380._4_4_ != 0) {
      uVar13 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar13) break;
        if (unaff_R15[uVar13] != *(char *)((long)unaff_R14 + uVar13)) {
          uVar12 = uVar13 & 0xffffffff;
          break;
        }
        uVar13 = uVar13 + 1;
      } while (local_380._4_4_ != (uint)uVar13);
    }
    if ((int)uVar12 == -1) {
      uVar3 = local_380._4_4_;
      if (local_380._4_4_ < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar12 = (ulong)(uVar3 - 1);
    }
    pcStack_408 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar12,uVar4,uVar5);
    pcStack_408 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R12 = (ulong)uVar3;
    pcStack_408 = (code *)0x133136;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    local_384 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_408 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_408 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_408 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      unaff_R13 = (undefined8 *)(ulong)__fd;
      if (__fd == 0xffffffff) goto LAB_0013318c;
      unaff_R12 = local_380 >> 0x20;
      pcStack_408 = (code *)0x133160;
      uVar12 = write(uVar3,unaff_R15,unaff_R12);
      if (uVar12 != unaff_R12) goto LAB_00133191;
      __n = (ulong)*(uint *)(__n + 4);
      pcStack_408 = (code *)0x133176;
      uVar12 = write(__fd,unaff_R14,__n);
      if (uVar12 == __n) {
        pcStack_408 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_408 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_408 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar7 = acStack_420;
  acStack_420[8] = '\0';
  acStack_420[9] = '\0';
  acStack_420[10] = '\0';
  acStack_420[0xb] = '\0';
  acStack_420[0xc] = '\0';
  acStack_420[0xd] = '\0';
  acStack_420[0xe] = '@';
  acStack_420[0xf] = '0';
  acStack_420[0] = '\v';
  acStack_420[1] = '\0';
  acStack_420[2] = '\0';
  acStack_420[3] = '\0';
  acStack_420[4] = '\0';
  acStack_420[5] = '\0';
  acStack_420[6] = '\0';
  acStack_420[7] = '\0';
  pcStack_430 = (code *)0x1331ce;
  pcStack_410 = (char *)__n;
  pcStack_408 = (code *)unaff_R14;
  plVar6 = (long *)bson_new();
  pcStack_430 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar6,"decimal128",0xffffffff,pcVar7);
  if (cVar1 == '\0') {
    pcStack_430 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_430 = (code *)0x1331f7;
    pcVar7 = (char *)bson_as_json(plVar6,auStack_428);
    if (pcVar7 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_430 = (code *)0x133221;
      bson_free(pcVar7);
      pcStack_430 = (code *)0x133229;
      bson_destroy(plVar6);
      return;
    }
    pcStack_430 = (code *)0x133215;
    iVar2 = strcmp(pcVar7,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_430 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar16 = &pcStack_430;
  pcStack_888 = (code *)0x133271;
  plStack_438 = plVar6;
  pcStack_430 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_698);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_888 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_800,auStack_780);
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_888 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_888 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_888 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_888 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_800,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_888 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_800);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar6 = &lStack_810;
    pcStack_888 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_800,plVar6);
    if (lStack_810 != 0xb) goto LAB_0013330b;
    if (lStack_808 == 0x3040000000000000) {
      pcStack_888 = (code *)0x1332f5;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_888 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_888 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar14 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar15 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_8a0 = plVar6;
  uStack_898 = unaff_R12;
  pcStack_890 = pcVar7;
  pcStack_888 = (code *)unaff_R15;
  do {
    pcStack_ab0 = (code *)0x133357;
    lVar8 = bson_new_from_json(pcVar14,0xffffffffffffffff,&iStack_aa0);
    if (lVar8 != 0) {
      pcStack_ab0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_ab0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_a98,
              unaff_R15);
      pcStack_ab0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_aa0 != 1) {
LAB_001333cc:
      pcStack_ab0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_cc8 = (code *)0x1333f1;
      pcStack_ab8 = acStack_a98;
      pcStack_ab0 = (code *)&iStack_aa0;
      pcVar7 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_cb8);
      pcStack_cc8 = (code *)0x1333fe;
      pcVar14 = (char *)bson_as_json(pcVar7,0);
      if (pcVar14 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_cc8 = (code *)0x133428;
        bson_free(pcVar14);
        pcStack_cc8 = (code *)0x133430;
        bson_destroy(pcVar7);
        return;
      }
      pcStack_cc8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar14,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_cc8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_ed8 = 0x2200223a2261227b;
      uStack_ed0 = 0x7d;
      uStack_edc = 0x227b;
      pcStack_cc8 = (code *)pcVar7;
      lVar8 = bson_new_from_json(&uStack_ed8,9,&iStack_ec8);
      if (lVar8 == 0) {
        if (iStack_ec8 != 1) goto LAB_001334fc;
        if (iStack_ec4 != 1) goto LAB_00133501;
        pcVar7 = acStack_ec0;
        pcVar9 = strstr(pcVar7,"Got parse error");
        if (pcVar9 == (char *)0x0) goto LAB_00133506;
        lVar8 = bson_new_from_json(&uStack_edc,3,&iStack_ec8);
        if (lVar8 != 0) goto LAB_001334f7;
        if (iStack_ec8 != 1) goto LAB_0013350e;
        if (iStack_ec4 == 1) {
          pcVar9 = strstr(pcVar7,"Got parse error");
          if (pcVar9 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar4 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar5 = bson_bcon_magic();
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0,uVar4,pcVar7,ppuVar15,unaff_R13,pcVar14,unaff_R15,
                       ppcVar16);
      uVar10 = bcon_new(0,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar4,uVar10,0);
      uVar4 = bson_new();
      uVar10 = bson_new();
      uVar11 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar4,uVar10,uVar11,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar4,0);
      uVar4 = bson_new();
      _test_json_produces_multiple("[]",0,uVar4,0);
      uVar4 = bcon_new(0,"0","{","x",uVar5,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar4,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_a9c != 2) {
      pcStack_ab0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    unaff_R15 = ppuVar15[-1];
    pcStack_ab0 = (code *)0x13337e;
    pcVar7 = strstr(acStack_a98,unaff_R15);
    if (pcVar7 == (char *)0x0) goto LAB_001333a4;
    pcVar14 = *ppuVar15;
    ppuVar15 = ppuVar15 + 2;
    if (pcVar14 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_bson_json_empty_final_object (void)
{
   const char *json = "{\"a\": {\"b\": {}}}";
   bson_t *bson = BCON_NEW ("a", "{", "b", "{", "}", "}");
   bson_t b = BSON_INITIALIZER;
   bool r;
   bson_error_t error;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);
   bson_eq_bson (&b, bson);

   bson_destroy (&b);
   bson_destroy (bson);
}